

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callable.hpp
# Opt level: O1

void __thiscall tmf::empty_callable::empty_callable(empty_callable *this,string *what)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"[empty_callable]: ",what);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_00105d98;
  return;
}

Assistant:

empty_callable(const std::string& what)
    : std::runtime_error("[empty_callable]: " + what)
  {}